

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMCharacterDataImpl.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::DOMCharacterDataImpl::insertData
          (DOMCharacterDataImpl *this,DOMNode *node,XMLSize_t offset,XMLCh *dat)

{
  short *psVar1;
  XMLCh *pXVar2;
  DOMBuffer *this_00;
  XMLSize_t XVar3;
  int iVar4;
  long *plVar5;
  long lVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  BaseRefVectorOf<xercesc_4_0::DOMRangeImpl> *this_01;
  DOMRangeImpl *this_02;
  DOMException *this_03;
  MemoryManager **ppMVar7;
  ulong uVar8;
  ulong extraNeeded;
  XMLSize_t i;
  XMLSize_t getAt;
  XMLSize_t maxChars;
  XMLCh temp [4096];
  XMLCh local_2038 [4100];
  XMLCh *target;
  
  if (node == (DOMNode *)0x0) {
    plVar5 = (long *)0x0;
  }
  else {
    plVar5 = (long *)__dynamic_cast(node,&DOMNode::typeinfo,&HasDOMNodeImpl::typeinfo,
                                    0xfffffffffffffffe);
  }
  if (plVar5 != (long *)0x0) {
    lVar6 = (**(code **)(*plVar5 + 0x18))(plVar5);
    if (lVar6 != 0) {
      lVar6 = (**(code **)(*plVar5 + 0x18))(plVar5);
      if ((*(ushort *)(lVar6 + 0x10) & 1) == 0) {
        uVar8 = this->fDataBuf->fIndex;
        if (offset <= uVar8) {
          maxChars = 0;
          if (dat != (XMLCh *)0x0) {
            do {
              psVar1 = (short *)((long)dat + maxChars);
              maxChars = maxChars + 2;
            } while (*psVar1 != 0);
            maxChars = ((long)maxChars >> 1) - 1;
          }
          uVar8 = uVar8 + maxChars;
          if (uVar8 < 0xfff) {
            target = local_2038;
          }
          else {
            iVar4 = (*XMLPlatformUtils::fgMemoryManager->_vptr_MemoryManager[3])
                              (XMLPlatformUtils::fgMemoryManager,uVar8 * 2 + 2);
            target = (XMLCh *)CONCAT44(extraout_var,iVar4);
          }
          pXVar2 = this->fDataBuf->fBuffer;
          extraNeeded = 0;
          pXVar2[this->fDataBuf->fIndex] = L'\0';
          XMLString::copyNString(target,pXVar2,offset);
          XMLString::copyNString(target + offset,dat,maxChars);
          pXVar2 = this->fDataBuf->fBuffer;
          pXVar2[this->fDataBuf->fIndex] = L'\0';
          XMLString::copyString(target + offset + maxChars,pXVar2 + offset);
          this_00 = this->fDataBuf;
          if (target != (XMLCh *)0x0) {
            lVar6 = 0;
            do {
              psVar1 = (short *)((long)target + lVar6);
              lVar6 = lVar6 + 2;
            } while (*psVar1 != 0);
            extraNeeded = (lVar6 >> 1) - 1;
          }
          this_00->fIndex = 0;
          if (this_00->fCapacity <= extraNeeded) {
            DOMBuffer::expandCapacity(this_00,extraNeeded,false);
          }
          memcpy(this_00->fBuffer,target,extraNeeded * 2);
          this_00->fIndex = extraNeeded;
          this_00->fBuffer[extraNeeded] = L'\0';
          if (0xffe < uVar8) {
            (*XMLPlatformUtils::fgMemoryManager->_vptr_MemoryManager[4])
                      (XMLPlatformUtils::fgMemoryManager,target);
          }
          iVar4 = (*node->_vptr_DOMNode[0xc])(node);
          lVar6 = CONCAT44(extraout_var_00,iVar4);
          if (lVar6 != 0) {
            this_01 = (BaseRefVectorOf<xercesc_4_0::DOMRangeImpl> *)
                      (**(code **)(*(long *)(lVar6 + -8) + 0x230))(lVar6 + -8);
            if ((this_01 != (BaseRefVectorOf<xercesc_4_0::DOMRangeImpl> *)0x0) &&
               (XVar3 = this_01->fCurCount, XVar3 != 0)) {
              getAt = 0;
              do {
                this_02 = BaseRefVectorOf<xercesc_4_0::DOMRangeImpl>::elementAt(this_01,getAt);
                DOMRangeImpl::updateRangeForInsertedText(this_02,node,offset,maxChars);
                getAt = getAt + 1;
              } while (XVar3 != getAt);
            }
          }
          return;
        }
        this_03 = (DOMException *)__cxa_allocate_exception(0x28);
        if (this->fDoc == (DOMDocumentImpl *)0x0) {
          ppMVar7 = &XMLPlatformUtils::fgMemoryManager;
        }
        else {
          ppMVar7 = &this->fDoc->fMemoryManager;
        }
        DOMException::DOMException(this_03,1,0,*ppMVar7);
      }
      else {
        this_03 = (DOMException *)__cxa_allocate_exception(0x28);
        if (this->fDoc == (DOMDocumentImpl *)0x0) {
          ppMVar7 = &XMLPlatformUtils::fgMemoryManager;
        }
        else {
          ppMVar7 = &this->fDoc->fMemoryManager;
        }
        DOMException::DOMException(this_03,7,0,*ppMVar7);
      }
      goto LAB_00267218;
    }
  }
  this_03 = (DOMException *)__cxa_allocate_exception(0x28);
  DOMException::DOMException(this_03,0xb,0,XMLPlatformUtils::fgMemoryManager);
LAB_00267218:
  __cxa_throw(this_03,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

void DOMCharacterDataImpl::insertData(const DOMNode *node, XMLSize_t offset, const XMLCh *dat)
{
    if (castToNodeImpl(node)->isReadOnly())
        throw DOMException(
        DOMException::NO_MODIFICATION_ALLOWED_ERR, 0, GetDOMCharacterDataImplMemoryManager);

    // Note: the C++ XMLCh * operation throws the correct DOMExceptions
    //       when parameter values are bad.
    //

    XMLSize_t len = fDataBuf->getLen();
    if (offset > len)
        throw DOMException(DOMException::INDEX_SIZE_ERR, 0, GetDOMCharacterDataImplMemoryManager);

    XMLSize_t datLen = XMLString::stringLen(dat);

    XMLSize_t newLen = len + datLen;

    XMLCh* newString;
    XMLCh temp[4096];
    if (newLen >= 4095)
        newString = (XMLCh*) XMLPlatformUtils::fgMemoryManager->allocate
        (
            (newLen + 1) * sizeof(XMLCh)
        );//new XMLCh[newLen+1];
    else
        newString = temp;

    XMLString::copyNString(newString, fDataBuf->getRawBuffer(), offset);
    XMLString::copyNString(newString+offset, dat, datLen);
    XMLString::copyString(newString+offset+datLen, fDataBuf->getRawBuffer()+offset);

    fDataBuf->set(newString);

    if (newLen >= 4095)
        XMLPlatformUtils::fgMemoryManager->deallocate(newString);//delete[] newString;

    DOMDocumentImpl *doc = (DOMDocumentImpl *)node->getOwnerDocument();
    if (doc != 0) {
        Ranges* ranges = doc->getRanges();
        if (ranges != 0) {
            XMLSize_t sz = ranges->size();
            if (sz != 0) {
                for (XMLSize_t i =0; i<sz; i++) {
                    ranges->elementAt(i)->updateRangeForInsertedText( (DOMNode*)node, offset, datLen);
                }
            }
        }
    }
}